

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateIntArray(int *numbers,int count)

{
  cJSON *item;
  cJSON *a;
  cJSON *p;
  cJSON *n;
  size_t i;
  int count_local;
  int *numbers_local;
  
  a = (cJSON *)0x0;
  if (count < 0) {
    numbers_local = (int *)0x0;
  }
  else {
    numbers_local = (int *)cJSON_CreateArray();
    for (n = (cJSON *)0x0; (cJSON *)numbers_local != (cJSON *)0x0 && n < (cJSON *)(long)count;
        n = (cJSON *)((long)&n->next + 1)) {
      item = cJSON_CreateNumber((double)numbers[(long)n]);
      if (item == (cJSON *)0x0) {
        cJSON_Delete((cJSON *)numbers_local);
        return (cJSON *)0x0;
      }
      if (n == (cJSON *)0x0) {
        ((cJSON *)numbers_local)->child = item;
      }
      else {
        suffix_object(a,item);
      }
      a = item;
    }
  }
  return (cJSON *)numbers_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateIntArray(const int *numbers, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if (count < 0)
    {
        return NULL;
    }

    a = cJSON_CreateArray();
    for(i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateNumber(numbers[i]);
        if (!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p, n);
        }
        p = n;
    }

    return a;
}